

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall
Centaurus::NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::print_subgraph
          (NFABase<Centaurus::NFABaseState<unsigned_char,_int>_> *this,wostream *os,int index,
          wstring *prefix)

{
  wostream *pwVar1;
  size_type sVar2;
  const_reference this_00;
  uint local_30;
  uint local_2c;
  uint i_1;
  uint i;
  wstring *prefix_local;
  int index_local;
  wostream *os_local;
  NFABase<Centaurus::NFABaseState<unsigned_char,_int>_> *this_local;
  
  pwVar1 = std::operator<<(os,L"subgraph cluster_");
  pwVar1 = std::operator<<(pwVar1,(wstring *)prefix);
  pwVar1 = std::operator<<(pwVar1,L" {");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar1 = std::operator<<(os,L"label=\"[");
  pwVar1 = (wostream *)std::wostream::operator<<(pwVar1,index);
  pwVar1 = std::operator<<(pwVar1,L"]\"");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  local_2c = 0;
  while( true ) {
    sVar2 = std::
            vector<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
            ::size(&this->m_states);
    if (sVar2 <= local_2c) break;
    pwVar1 = std::operator<<(os,(wstring *)prefix);
    pwVar1 = std::operator<<(pwVar1,L"_S");
    pwVar1 = (wostream *)std::wostream::operator<<(pwVar1,local_2c);
    std::operator<<(pwVar1,L" [ label=\"");
    (*this->_vptr_NFABase[2])(this,os,(ulong)local_2c);
    pwVar1 = std::operator<<(os,L"\", shape=circle ];");
    std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
    local_2c = local_2c + 1;
  }
  local_30 = 0;
  while( true ) {
    sVar2 = std::
            vector<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
            ::size(&this->m_states);
    if (sVar2 <= local_30) break;
    this_00 = std::
              vector<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
              ::operator[](&this->m_states,(ulong)local_30);
    NFABaseState<unsigned_char,_int>::print_subgraph(this_00,os,local_30,prefix);
    local_30 = local_30 + 1;
  }
  pwVar1 = std::operator<<(os,L"}");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  return;
}

Assistant:

void print_subgraph(std::wostream& os, int index, const std::wstring& prefix) const
	{
		os << L"subgraph cluster_" << prefix << L" {" << std::endl;
		os << L"label=\"[" << index << L"]\"" << std::endl;
		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			os << prefix << L"_S" << i << L" [ label=\"";
			print_state(os, i);
			os << L"\", shape=circle ];" << std::endl;
		}
		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			m_states[i].print_subgraph(os, i, prefix);
		}
		os << L"}" << std::endl;
	}